

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

OptionValue * __thiscall cxxopts::ParseResult::operator[](ParseResult *this,string *option)

{
  bool bVar1;
  element_type *peVar2;
  option_not_present_exception *this_00;
  pointer ppVar3;
  pointer pvVar4;
  _Node_iterator_base<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_false>
  local_40;
  const_iterator riter;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_20;
  iterator iter;
  string *option_local;
  ParseResult *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
               )option;
  peVar2 = std::
           __shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::find(peVar2,iter.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                     ._M_cur);
  peVar2 = std::
           __shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::end(peVar2);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                           *)&local_20);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>_>
         ::find(&this->m_results,&ppVar3->second);
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_false,_false>
                           *)&local_40);
    return &pvVar4->second;
  }
  this_00 = (option_not_present_exception *)__cxa_allocate_exception(0x28);
  option_not_present_exception::option_not_present_exception
            (this_00,(string *)
                     iter.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                     ._M_cur);
  __cxa_throw(this_00,&option_not_present_exception::typeinfo,
              option_not_present_exception::~option_not_present_exception);
}

Assistant:

const OptionValue &operator[](const std::string &option) const {
    auto iter = m_options->find(option);

    if (iter == m_options->end()) {
      throw option_not_present_exception(option);
    }

    auto riter = m_results.find(iter->second);

    return riter->second;
  }